

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_initDStream_usingDict(ZSTD_DStream *zds,void *dict,size_t dictSize)

{
  size_t sVar1;
  
  zds->streamStage = zdss_init;
  zds->noForwardProgress = 0;
  sVar1 = ZSTD_DCtx_loadDictionary_advanced(zds,dict,dictSize,ZSTD_dlm_byCopy,ZSTD_dct_auto);
  if (sVar1 < 0xffffffffffffff89) {
    if (ZSTD_f_zstd1_magicless < zds->format) {
      __assert_fail("(format == ZSTD_f_zstd1) || (format == ZSTD_f_zstd1_magicless)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x5a00,"size_t ZSTD_startingInputLength(ZSTD_format_e)");
    }
    sVar1 = (ulong)(zds->format == ZSTD_f_zstd1) * 4 + 1;
  }
  return sVar1;
}

Assistant:

size_t ZSTD_initDStream_usingDict(ZSTD_DStream* zds, const void* dict, size_t dictSize)
{
    DEBUGLOG(4, "ZSTD_initDStream_usingDict");
    FORWARD_IF_ERROR( ZSTD_DCtx_reset(zds, ZSTD_reset_session_only) );
    FORWARD_IF_ERROR( ZSTD_DCtx_loadDictionary(zds, dict, dictSize) );
    return ZSTD_startingInputLength(zds->format);
}